

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Regexp * re2::Regexp::Repeat(Regexp *sub,ParseFlags flags,int min,int max)

{
  Regexp *pRVar1;
  
  pRVar1 = (Regexp *)operator_new(0x28);
  pRVar1->op_ = '\n';
  pRVar1->simple_ = '\0';
  pRVar1->parse_flags_ = (uint16)flags;
  pRVar1->ref_ = 1;
  *(undefined8 *)&pRVar1->nsub_ = 0;
  *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
  *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
  *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
  *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
  pRVar1->nsub_ = 1;
  (pRVar1->field_5).subone_ = sub;
  (pRVar1->field_7).field_0.min_ = min;
  (pRVar1->field_7).field_0.max_ = max;
  return pRVar1;
}

Assistant:

Regexp* Regexp::Repeat(Regexp* sub, ParseFlags flags, int min, int max) {
  Regexp* re = new Regexp(kRegexpRepeat, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  re->min_ = min;
  re->max_ = max;
  return re;
}